

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

void __thiscall ncnn::Convolution_x86::forward(Convolution_x86 *this)

{
  Option *in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  
  forward((Convolution_x86 *)
          ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-9]),in_RSI,in_RDX
          ,in_RCX);
  return;
}

Assistant:

int Convolution_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    if (bottom_blob.dims != 3)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }

    if ((dilation_w > 1 || dilation_h > 1) && (stride_w > 1 || stride_h > 1))
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    if ((dilation_w > 1 || dilation_h > 1) && dilation_w != dilation_h)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        if (outw < dilation_w || outh < dilation_h)
        {
            return Convolution::forward(bottom_blob, top_blob, opt);
        }

        return forwardDilation_x86(bottom_blob_bordered, top_blob, opt);
    }

    if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if (use_winograd3x3 && outw >= 8 && outh >=8)
        {
            conv3x3s1_winograd23_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data, bias_data, opt);
//             conv3x3s1_winograd43_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd43_data, bias_data, opt);
        }
        else
        {
            conv_im2col_sgemm_sse(bottom_blob_bordered, top_blob, weight_sgemm_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, opt);
        }

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }
    else
    {
//         conv1x1s1_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
//         conv1x1s2_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
//         conv3x3s1_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
//         conv3x3s2_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
//         conv5x5s1_neon(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);

        conv_im2col_sgemm_sse(bottom_blob_bordered, top_blob, weight_sgemm_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, opt);

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }

    return 0;
}